

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O1

uint8_t * __thiscall pktalloc::Allocator::allocateFromNewWindow(Allocator *this,uint units)

{
  bool bVar1;
  uint uVar2;
  void *pvVar3;
  WindowHeader *this_00;
  uint8_t *puVar4;
  
  pvVar3 = calloc(1,0x10140);
  if (pvVar3 == (void *)0x0) {
    this_00 = (WindowHeader *)0x0;
  }
  else {
    uVar2 = (uint)pvVar3 & 0x1f;
    *(char *)((long)pvVar3 + (0x1f - (ulong)uVar2)) = (char)uVar2;
    this_00 = (WindowHeader *)((long)pvVar3 + (0x20 - (ulong)uVar2));
  }
  if (this_00 == (WindowHeader *)0x0) {
    puVar4 = (uint8_t *)0x0;
  }
  else {
    *(undefined8 *)&this_00->field_0xc0 = 0;
    *(undefined8 *)&this_00->field_0xc8 = 0;
    *(undefined8 *)&this_00->field_0xd0 = 0;
    *(undefined8 *)&this_00->field_0xd8 = 0;
    *(undefined8 *)&this_00->field_0xe0 = 0;
    *(undefined8 *)&this_00->field_0xe8 = 0;
    *(undefined8 *)&this_00->field_0xf0 = 0;
    *(undefined8 *)&this_00->field_0xf8 = 0;
    *(undefined8 *)&this_00->field_0x80 = 0;
    *(undefined8 *)&this_00->field_0x88 = 0;
    *(undefined8 *)&this_00->field_0x90 = 0;
    *(undefined8 *)&this_00->field_0x98 = 0;
    *(undefined8 *)&this_00->field_0xa0 = 0;
    *(undefined8 *)&this_00->field_0xa8 = 0;
    *(undefined8 *)&this_00->field_0xb0 = 0;
    *(undefined8 *)&this_00->field_0xb8 = 0;
    *(undefined8 *)&this_00->field_0x40 = 0;
    *(undefined8 *)&this_00->field_0x48 = 0;
    *(undefined8 *)&this_00->field_0x50 = 0;
    *(undefined8 *)&this_00->field_0x58 = 0;
    *(undefined8 *)&this_00->field_0x60 = 0;
    *(undefined8 *)&this_00->field_0x68 = 0;
    *(undefined8 *)&this_00->field_0x70 = 0;
    *(undefined8 *)&this_00->field_0x78 = 0;
    *(undefined8 *)this_00 = 0;
    *(undefined8 *)&this_00->field_0x8 = 0;
    *(undefined8 *)&this_00->field_0x10 = 0;
    *(undefined8 *)&this_00->field_0x18 = 0;
    *(undefined8 *)&this_00->field_0x20 = 0;
    *(undefined8 *)&this_00->field_0x28 = 0;
    *(undefined8 *)&this_00->field_0x30 = 0;
    *(undefined8 *)&this_00->field_0x38 = 0;
    CustomBitSet<2048U>::SetRange(&this_00->Used,0,units);
    this_00->FreeUnitCount = 0x800 - units;
    this_00->ResumeScanOffset = units;
    this_00->Preallocated = false;
    this_00->FullListIndex = -1;
    uVar2 = (this->PreferredWindows).Size;
    bVar1 = LightVector<pktalloc::Allocator::WindowHeader_*>::SetSize_Copy
                      (&this->PreferredWindows,uVar2 + 1);
    if (bVar1) {
      (this->PreferredWindows).DataPtr[uVar2] = this_00;
    }
    *(WindowHeader **)&this_00[1].field_0x10 = this_00;
    *(uint *)&this_00[1].field_0x18 = units;
    puVar4 = &this_00[1].field_0x30;
  }
  return puVar4;
}

Assistant:

uint8_t* Allocator::allocateFromNewWindow(unsigned units)
{
    ALLOC_DEBUG_INTEGRITY_CHECK();

    uint8_t* headerStart = SIMDSafeAllocate(kWindowSizeBytes);
    if (!headerStart) {
        return nullptr; // Allocation failure
    }

    // Update window header
    WindowHeader* window = (WindowHeader*)headerStart;
    window->Used.ClearAll();
    window->Used.SetRange(0, units);
    window->FreeUnitCount = kWindowMaxUnits - units;
    window->ResumeScanOffset = units;
    window->Preallocated = false;
    PKTALLOC_DEBUG_ASSERT(PreferredWindows.GetSize() == 0);
    window->FullListIndex = kNotInFullList;
    PreferredWindows.Append(window);

    // Carve out region
    AllocationHeader* regionHeader = (AllocationHeader*)(headerStart + kWindowHeaderBytes);
#ifdef PKTALLOC_DEBUG
    regionHeader->Canary = AllocationHeader::kCanaryExpected;
#endif // PKTALLOC_DEBUG
    regionHeader->Header = window;
    regionHeader->UsedUnits = units;

    uint8_t* data = (uint8_t*)regionHeader + kUnitSize;
#ifdef PKTALLOC_SCRUB_MEMORY
    memset(data, 0, (units - 1) * kUnitSize);
#endif // PKTALLOC_SCRUB_MEMORY
    PKTALLOC_DEBUG_ASSERT((uintptr_t)data % kUnitSize == 0);

    ALLOC_DEBUG_INTEGRITY_CHECK();

    return data;
}